

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.cpp
# Opt level: O2

void __thiscall AppendFile::append(AppendFile *this,char *logline,size_t len)

{
  int iVar1;
  ssize_t sVar2;
  ssize_t sVar3;
  size_t in_RCX;
  
  sVar2 = write(this,(int)logline,(void *)len,in_RCX);
  do {
    if ((void *)(len - sVar2) == (void *)0x0) {
      return;
    }
    sVar3 = write(this,(int)logline + (int)sVar2,(void *)(len - sVar2),in_RCX);
    sVar2 = sVar2 + sVar3;
  } while (sVar3 != 0);
  iVar1 = ferror((FILE *)this->fp_);
  if (iVar1 == 0) {
    return;
  }
  fwrite("AppendFile::append() failed !\n",0x1e,1,_stderr);
  return;
}

Assistant:

void AppendFile::append(const char* logline, const size_t len) {
  size_t n = this->write(logline, len);
  size_t remain = len - n;
  while (remain > 0) {
    size_t x = this->write(logline + n, remain);
    if (x == 0) {
      int err = ferror(fp_);
      if (err) fprintf(stderr, "AppendFile::append() failed !\n");
      break;
    }
    n += x;
    remain = len - n;
  }
}